

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::ValidateFileOptions
          (DescriptorBuilder *this,FileDescriptor *file,FileDescriptorProto *proto)

{
  long lVar1;
  FileOptions *pFVar2;
  string *element_name;
  LogMessage *pLVar3;
  FileOptions *pFVar4;
  long *plVar5;
  size_type *psVar6;
  long lVar7;
  long lVar8;
  undefined1 local_88 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (0 < *(int *)(file + 0x48)) {
    lVar7 = 0;
    lVar8 = 0;
    do {
      lVar1 = *(long *)(file + 0x50);
      if ((proto->message_type_).super_RepeatedPtrFieldBase.current_size_ <= lVar8) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_88,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                   ,0x338);
        pLVar3 = internal::LogMessage::operator<<
                           ((LogMessage *)local_88,"CHECK failed: (index) < (size()): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar3);
        internal::LogMessage::~LogMessage((LogMessage *)local_88);
      }
      ValidateMessageOptions
                (this,(Descriptor *)(lVar1 + lVar7),
                 (DescriptorProto *)
                 (proto->message_type_).super_RepeatedPtrFieldBase.elements_[lVar8]);
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0x78;
    } while (lVar8 < *(int *)(file + 0x48));
  }
  if (0 < *(int *)(file + 0x58)) {
    lVar7 = 0;
    lVar8 = 0;
    do {
      lVar1 = *(long *)(file + 0x60);
      if ((proto->enum_type_).super_RepeatedPtrFieldBase.current_size_ <= lVar8) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_88,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                   ,0x338);
        pLVar3 = internal::LogMessage::operator<<
                           ((LogMessage *)local_88,"CHECK failed: (index) < (size()): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar3);
        internal::LogMessage::~LogMessage((LogMessage *)local_88);
      }
      ValidateEnumOptions(this,(EnumDescriptor *)(lVar1 + lVar7),
                          (EnumDescriptorProto *)
                          (proto->enum_type_).super_RepeatedPtrFieldBase.elements_[lVar8]);
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0x38;
    } while (lVar8 < *(int *)(file + 0x58));
  }
  if (0 < *(int *)(file + 0x68)) {
    lVar7 = 0;
    lVar8 = 0;
    do {
      lVar1 = *(long *)(file + 0x70);
      if ((proto->service_).super_RepeatedPtrFieldBase.current_size_ <= lVar8) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_88,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                   ,0x338);
        pLVar3 = internal::LogMessage::operator<<
                           ((LogMessage *)local_88,"CHECK failed: (index) < (size()): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar3);
        internal::LogMessage::~LogMessage((LogMessage *)local_88);
      }
      ValidateServiceOptions
                (this,(ServiceDescriptor *)(lVar1 + lVar7),
                 (ServiceDescriptorProto *)
                 (proto->service_).super_RepeatedPtrFieldBase.elements_[lVar8]);
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0x30;
    } while (lVar8 < *(int *)(file + 0x68));
  }
  if (0 < *(int *)(file + 0x78)) {
    lVar7 = 0;
    lVar8 = 0;
    do {
      lVar1 = *(long *)(file + 0x80);
      if ((proto->extension_).super_RepeatedPtrFieldBase.current_size_ <= lVar8) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_88,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                   ,0x338);
        pLVar3 = internal::LogMessage::operator<<
                           ((LogMessage *)local_88,"CHECK failed: (index) < (size()): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar3);
        internal::LogMessage::~LogMessage((LogMessage *)local_88);
      }
      ValidateFieldOptions
                (this,(FieldDescriptor *)(lVar1 + lVar7),
                 (FieldDescriptorProto *)
                 (proto->extension_).super_RepeatedPtrFieldBase.elements_[lVar8]);
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0x78;
    } while (lVar8 < *(int *)(file + 0x78));
  }
  pFVar2 = *(FileOptions **)(file + 0x88);
  pFVar4 = FileOptions::default_instance();
  if (((pFVar2 == pFVar4) || (*(int *)(*(long *)(file + 0x88) + 0x50) != 3)) &&
     (0 < *(int *)(file + 0x18))) {
    lVar7 = 0;
    do {
      lVar8 = *(long *)(*(long *)(file + 0x20) + lVar7 * 8);
      if (((lVar8 != 0) &&
          (pFVar2 = *(FileOptions **)(lVar8 + 0x88), pFVar4 = FileOptions::default_instance(),
          pFVar2 != pFVar4)) && (*(int *)(*(long *)(lVar8 + 0x88) + 0x50) == 3)) {
        element_name = *(string **)file;
        std::operator+(&local_50,
                       "Files that do not use optimize_for = LITE_RUNTIME cannot import files which do use this option.  This file is not lite, but it imports \""
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        **(undefined8 **)(*(long *)(file + 0x20) + lVar7 * 8));
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
        psVar6 = (size_type *)(plVar5 + 2);
        if ((size_type *)*plVar5 == psVar6) {
          local_88._16_8_ = *psVar6;
          local_88._24_8_ = plVar5[3];
          local_88._0_8_ = local_88 + 0x10;
        }
        else {
          local_88._16_8_ = *psVar6;
          local_88._0_8_ = (size_type *)*plVar5;
        }
        local_88._8_8_ = plVar5[1];
        *plVar5 = (long)psVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        AddError(this,element_name,&proto->super_Message,OTHER,(string *)local_88);
        if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
          operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p == &local_50.field_2) {
          return;
        }
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        return;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < *(int *)(file + 0x18));
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateFileOptions(FileDescriptor* file,
                                            const FileDescriptorProto& proto) {
  VALIDATE_OPTIONS_FROM_ARRAY(file, message_type, Message);
  VALIDATE_OPTIONS_FROM_ARRAY(file, enum_type, Enum);
  VALIDATE_OPTIONS_FROM_ARRAY(file, service, Service);
  VALIDATE_OPTIONS_FROM_ARRAY(file, extension, Field);

  // Lite files can only be imported by other Lite files.
  if (!IsLite(file)) {
    for (int i = 0; i < file->dependency_count(); i++) {
      if (IsLite(file->dependency(i))) {
        AddError(
          file->name(), proto,
          DescriptorPool::ErrorCollector::OTHER,
          "Files that do not use optimize_for = LITE_RUNTIME cannot import "
          "files which do use this option.  This file is not lite, but it "
          "imports \"" + file->dependency(i)->name() + "\" which is.");
        break;
      }
    }
  }
}